

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O2

void duckdb::SetSelectionVector
               (SelectionVector *sel,data_ptr_t indices_p,LogicalType *logical_type,idx_t size,
               ValidityMask *mask,idx_t last_element_pos)

{
  LogicalTypeId LVar1;
  sel_t *psVar2;
  bool bVar3;
  unsigned_long uVar4;
  NotImplementedException *this;
  ConversionException *pCVar5;
  uint uVar6;
  uint uVar7;
  idx_t iVar8;
  idx_t row_8;
  idx_t iVar9;
  uchar *indices;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  
  SelectionVector::Initialize(sel,size);
  LVar1 = logical_type->id_;
  if (mask == (ValidityMask *)0x0) {
    switch(LVar1 - 0xb) {
    case 0:
      psVar2 = sel->sel_vector;
      for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
        psVar2[iVar9] = (int)(char)indices_p[iVar9];
      }
      break;
    case 1:
      psVar2 = sel->sel_vector;
      for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
        psVar2[iVar9] = (int)*(short *)(indices_p + iVar9 * 2);
      }
      break;
    case 2:
      psVar2 = sel->sel_vector;
      for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
        psVar2[iVar9] = *(sel_t *)(indices_p + iVar9 * 4);
      }
      break;
    case 3:
      if (last_element_pos >> 0x20 == 0) {
        psVar2 = sel->sel_vector;
        for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
          psVar2[iVar9] = *(sel_t *)(indices_p + iVar9 * 8);
        }
      }
      else {
        for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
          if (0xffffffff < *(long *)(indices_p + iVar9 * 8)) {
            pCVar5 = (ConversionException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_90,"DuckDB only supports indices that fit on an uint32",
                       &local_91);
            ConversionException::ConversionException(pCVar5,&local_90);
            __cxa_throw(pCVar5,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
          }
          uVar4 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                            (*(long *)(indices_p + iVar9 * 8));
          sel->sel_vector[iVar9] = (sel_t)uVar4;
        }
      }
      break;
    default:
      switch(LVar1) {
      case UTINYINT:
        psVar2 = sel->sel_vector;
        for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
          psVar2[iVar9] = (uint)indices_p[iVar9];
        }
        break;
      case USMALLINT:
        psVar2 = sel->sel_vector;
        for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
          psVar2[iVar9] = (uint)*(ushort *)(indices_p + iVar9 * 2);
        }
        break;
      case UINTEGER:
        psVar2 = sel->sel_vector;
        for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
          psVar2[iVar9] = *(sel_t *)(indices_p + iVar9 * 4);
        }
        break;
      case UBIGINT:
        psVar2 = sel->sel_vector;
        if (last_element_pos >> 0x20 == 0) {
          for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
            psVar2[iVar9] = *(sel_t *)(indices_p + iVar9 * 8);
          }
        }
        else {
          for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
            if (*(ulong *)(indices_p + iVar9 * 8) >> 0x20 != 0) {
              pCVar5 = (ConversionException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&local_90,"DuckDB only supports indices that fit on an uint32",
                         &local_91);
              ConversionException::ConversionException(pCVar5,&local_90);
              __cxa_throw(pCVar5,&ConversionException::typeinfo,::std::runtime_error::~runtime_error
                         );
            }
            psVar2[iVar9] = (sel_t)*(ulong *)(indices_p + iVar9 * 8);
          }
        }
        break;
      default:
        pCVar5 = (ConversionException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_90,"(Arrow) Unsupported type for selection vectors %s",&local_91
                  );
        LogicalType::ToString_abi_cxx11_(&local_70,logical_type);
        ConversionException::ConversionException<std::__cxx11::string>(pCVar5,&local_90,&local_70);
        __cxa_throw(pCVar5,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  else {
    uVar6 = (uint)last_element_pos;
    switch(LVar1 - 0xb) {
    case 0:
      for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&mask->super_TemplatedValidityMask<unsigned_long>,iVar9);
        uVar7 = uVar6;
        if (bVar3) {
          uVar7 = (uint)(char)indices_p[iVar9];
        }
        sel->sel_vector[iVar9] = uVar7;
      }
      break;
    case 1:
      for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&mask->super_TemplatedValidityMask<unsigned_long>,iVar9);
        uVar7 = uVar6;
        if (bVar3) {
          uVar7 = (uint)*(short *)(indices_p + iVar9 * 2);
        }
        sel->sel_vector[iVar9] = uVar7;
      }
      break;
    case 2:
      for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&mask->super_TemplatedValidityMask<unsigned_long>,iVar9);
        uVar7 = uVar6;
        if (bVar3) {
          uVar7 = *(uint *)(indices_p + iVar9 * 4);
        }
        sel->sel_vector[iVar9] = uVar7;
      }
      break;
    case 3:
      if (last_element_pos >> 0x20 != 0) {
        pCVar5 = (ConversionException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_90,"DuckDB only supports indices that fit on an uint32",
                   &local_91);
        ConversionException::ConversionException(pCVar5,&local_90);
        __cxa_throw(pCVar5,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
      for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&mask->super_TemplatedValidityMask<unsigned_long>,iVar9);
        iVar8 = last_element_pos;
        if (bVar3) {
          iVar8 = *(idx_t *)(indices_p + iVar9 * 8);
        }
        sel->sel_vector[iVar9] = (sel_t)iVar8;
      }
      break;
    default:
      switch(LVar1) {
      case UTINYINT:
        for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
          bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&mask->super_TemplatedValidityMask<unsigned_long>,iVar9);
          uVar7 = uVar6;
          if (bVar3) {
            uVar7 = (uint)indices_p[iVar9];
          }
          sel->sel_vector[iVar9] = uVar7;
        }
        break;
      case USMALLINT:
        for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
          bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&mask->super_TemplatedValidityMask<unsigned_long>,iVar9);
          uVar7 = uVar6;
          if (bVar3) {
            uVar7 = (uint)*(ushort *)(indices_p + iVar9 * 2);
          }
          sel->sel_vector[iVar9] = uVar7;
        }
        break;
      case UINTEGER:
        if (last_element_pos >> 0x20 != 0) {
          pCVar5 = (ConversionException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_90,"DuckDB only supports indices that fit on an uint32",
                     &local_91);
          ConversionException::ConversionException(pCVar5,&local_90);
          __cxa_throw(pCVar5,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
        }
        for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
          bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&mask->super_TemplatedValidityMask<unsigned_long>,iVar9);
          uVar7 = uVar6;
          if (bVar3) {
            uVar7 = *(uint *)(indices_p + iVar9 * 4);
          }
          sel->sel_vector[iVar9] = uVar7;
        }
        break;
      case UBIGINT:
        if (last_element_pos >> 0x20 != 0) {
          pCVar5 = (ConversionException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_90,"DuckDB only supports indices that fit on an uint32",
                     &local_91);
          ConversionException::ConversionException(pCVar5,&local_90);
          __cxa_throw(pCVar5,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
        }
        for (iVar9 = 0; size != iVar9; iVar9 = iVar9 + 1) {
          bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&mask->super_TemplatedValidityMask<unsigned_long>,iVar9);
          iVar8 = last_element_pos;
          if (bVar3) {
            iVar8 = *(idx_t *)(indices_p + iVar9 * 8);
          }
          sel->sel_vector[iVar9] = (sel_t)iVar8;
        }
        break;
      default:
        this = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_90,"(Arrow) Unsupported type for selection vectors %s",&local_91
                  );
        LogicalType::ToString_abi_cxx11_(&local_50,logical_type);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this,&local_90,&local_50);
        __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

static void SetSelectionVector(SelectionVector &sel, data_ptr_t indices_p, const LogicalType &logical_type, idx_t size,
                               ValidityMask *mask = nullptr, idx_t last_element_pos = 0) {
	sel.Initialize(size);

	if (mask) {
		switch (logical_type.id()) {
		case LogicalTypeId::UTINYINT:
			SetMaskedSelectionVectorLoop<uint8_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::TINYINT:
			SetMaskedSelectionVectorLoop<int8_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::USMALLINT:
			SetMaskedSelectionVectorLoop<uint16_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::SMALLINT:
			SetMaskedSelectionVectorLoop<int16_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::UINTEGER:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! Its guaranteed that our indices will point to the last element, so just throw an error
				throw ConversionException("DuckDB only supports indices that fit on an uint32");
			}
			SetMaskedSelectionVectorLoop<uint32_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::INTEGER:
			SetMaskedSelectionVectorLoop<int32_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::UBIGINT:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! Its guaranteed that our indices will point to the last element, so just throw an error
				throw ConversionException("DuckDB only supports indices that fit on an uint32");
			}
			SetMaskedSelectionVectorLoop<uint64_t>(sel, indices_p, size, *mask, last_element_pos);
			break;
		case LogicalTypeId::BIGINT:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! Its guaranteed that our indices will point to the last element, so just throw an error
				throw ConversionException("DuckDB only supports indices that fit on an uint32");
			}
			SetMaskedSelectionVectorLoop<int64_t>(sel, indices_p, size, *mask, last_element_pos);
			break;

		default:
			throw NotImplementedException("(Arrow) Unsupported type for selection vectors %s", logical_type.ToString());
		}

	} else {
		switch (logical_type.id()) {
		case LogicalTypeId::UTINYINT:
			SetSelectionVectorLoop<uint8_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::TINYINT:
			SetSelectionVectorLoop<int8_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::USMALLINT:
			SetSelectionVectorLoop<uint16_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::SMALLINT:
			SetSelectionVectorLoop<int16_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::UINTEGER:
			SetSelectionVectorLoop<uint32_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::INTEGER:
			SetSelectionVectorLoop<int32_t>(sel, indices_p, size);
			break;
		case LogicalTypeId::UBIGINT:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! We need to check if our indexes fit in a uint32_t
				SetSelectionVectorLoopWithChecks<uint64_t>(sel, indices_p, size);
			} else {
				SetSelectionVectorLoop<uint64_t>(sel, indices_p, size);
			}
			break;
		case LogicalTypeId::BIGINT:
			if (last_element_pos > NumericLimits<uint32_t>::Maximum()) {
				//! We need to check if our indexes fit in a uint32_t
				SetSelectionVectorLoopWithChecks<int64_t>(sel, indices_p, size);
			} else {
				SetSelectionVectorLoop<int64_t>(sel, indices_p, size);
			}
			break;
		default:
			throw ConversionException("(Arrow) Unsupported type for selection vectors %s", logical_type.ToString());
		}
	}
}